

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_map_field.cc
# Opt level: O0

char * google::protobuf::compiler::objectivec::anon_unknown_7::MapEntryTypeName
                 (FieldDescriptor *descriptor,bool isKey)

{
  LogMessage *other;
  FieldDescriptor *local_78;
  LogFinisher local_65 [13];
  LogMessage local_58;
  ObjectiveCType local_20;
  byte local_19;
  ObjectiveCType type;
  bool isKey_local;
  FieldDescriptor *descriptor_local;
  
  local_19 = isKey;
  _type = descriptor;
  local_20 = GetObjectiveCType(descriptor);
  switch(local_20) {
  case OBJECTIVECTYPE_INT32:
    descriptor_local = (FieldDescriptor *)0x76d65a;
    break;
  case OBJECTIVECTYPE_UINT32:
    descriptor_local = (FieldDescriptor *)0x7cd5e8;
    break;
  case OBJECTIVECTYPE_INT64:
    descriptor_local = (FieldDescriptor *)0x76d661;
    break;
  case OBJECTIVECTYPE_UINT64:
    descriptor_local = (FieldDescriptor *)0x7cd62a;
    break;
  case OBJECTIVECTYPE_FLOAT:
    descriptor_local = (FieldDescriptor *)0x771d8c;
    break;
  case OBJECTIVECTYPE_DOUBLE:
    descriptor_local = (FieldDescriptor *)0x771d9c;
    break;
  case OBJECTIVECTYPE_BOOLEAN:
    descriptor_local = (FieldDescriptor *)0x7cd6e3;
    break;
  case OBJECTIVECTYPE_STRING:
    if ((local_19 & 1) == 0) {
      local_78 = (FieldDescriptor *)0x773616;
    }
    else {
      local_78 = (FieldDescriptor *)0x771d3b;
    }
    descriptor_local = local_78;
    break;
  case OBJECTIVECTYPE_DATA:
    descriptor_local = (FieldDescriptor *)0x773616;
    break;
  case OBJECTIVECTYPE_ENUM:
    descriptor_local = (FieldDescriptor *)0x778733;
    break;
  case OBJECTIVECTYPE_MESSAGE:
    descriptor_local = (FieldDescriptor *)0x773616;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_map_field.cc"
               ,0x4e);
    other = internal::LogMessage::operator<<(&local_58,"Can\'t get here.");
    internal::LogFinisher::operator=(local_65,other);
    internal::LogMessage::~LogMessage(&local_58);
    descriptor_local = (FieldDescriptor *)0x0;
  }
  return (char *)descriptor_local;
}

Assistant:

const char* MapEntryTypeName(const FieldDescriptor* descriptor, bool isKey) {
  ObjectiveCType type = GetObjectiveCType(descriptor);
  switch (type) {
    case OBJECTIVECTYPE_INT32:
      return "Int32";
    case OBJECTIVECTYPE_UINT32:
      return "UInt32";
    case OBJECTIVECTYPE_INT64:
      return "Int64";
    case OBJECTIVECTYPE_UINT64:
      return "UInt64";
    case OBJECTIVECTYPE_FLOAT:
      return "Float";
    case OBJECTIVECTYPE_DOUBLE:
      return "Double";
    case OBJECTIVECTYPE_BOOLEAN:
      return "Bool";
    case OBJECTIVECTYPE_STRING:
      return (isKey ? "String" : "Object");
    case OBJECTIVECTYPE_DATA:
      return "Object";
    case OBJECTIVECTYPE_ENUM:
      return "Enum";
    case OBJECTIVECTYPE_MESSAGE:
      return "Object";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}